

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O1

PmError Pm_Dequeue(PmQueue *q,void *msg)

{
  int *__s;
  int iVar1;
  ulong uVar2;
  long lVar3;
  int32_t *msg_as_int32;
  PmQueueRep *queue;
  long lVar4;
  
  if (q == (PmQueue *)0x0) {
    return pmBadPtr;
  }
  if (*(int *)((long)q + 0x24) == 0) {
    if (*(int *)((long)q + 0x38) == 0) {
      lVar4 = *q;
      if ((*(long *)((long)q + 0x18) == lVar4 + 1) &&
         (*(int *)(*(long *)((long)q + 0x28) + lVar4 * 4) == 0)) {
        *(undefined8 *)((long)q + 0x18) = 0;
        return pmBufferOverflow;
      }
      uVar2 = (ulong)*(uint *)((long)q + 0x20);
      while (0 < (int)uVar2) {
        lVar3 = uVar2 * 4;
        uVar2 = uVar2 - 1;
        if (*(int *)(*(long *)((long)q + 0x28) + lVar4 * 4 + -4 + lVar3) == 0) {
          return pmNoData;
        }
      }
      memcpy(msg,(void *)((lVar4 + 1) * 4 + *(long *)((long)q + 0x28)),
             (long)(int)*(uint *)((long)q + 0x20) * 4 - 4);
      __s = (int *)(*(long *)((long)q + 0x28) + lVar4 * 4);
      iVar1 = *__s;
      while (iVar1 < *(int *)((long)q + 0x20)) {
        lVar3 = (long)iVar1;
        iVar1 = *(int *)((long)msg + lVar3 * 4 + -4);
        *(undefined4 *)((long)msg + lVar3 * 4 + -4) = 0;
      }
      memset(__s,0,(long)*(int *)((long)q + 0x20) << 2);
      lVar4 = lVar4 + *(int *)((long)q + 0x20);
      lVar3 = 0;
      if (lVar4 != *(long *)((long)q + 0x10)) {
        lVar3 = lVar4;
      }
      *(long *)q = lVar3;
    }
    else {
      memcpy(msg,*(void **)((long)q + 0x30),(long)*(int *)((long)q + 0x20) * 4 - 4);
      *(undefined4 *)((long)q + 0x38) = 0;
    }
    return pmGotData;
  }
  *(undefined4 *)((long)q + 0x24) = 0;
  return pmBufferOverflow;
}

Assistant:

PMEXPORT PmError Pm_Dequeue(PmQueue *q, void *msg)
{
    long head;
    PmQueueRep *queue = (PmQueueRep *) q;
    int i;
    int32_t *msg_as_int32 = (int32_t *) msg;

    /* arg checking */
    if (!queue)
        return pmBadPtr;
    /* a previous peek operation encountered an overflow, but the overflow
     * has not yet been reported to client, so do it now. No message is
     * returned, but on the next call, we will return the peek buffer.
     */
    if (queue->peek_overflow) {
        queue->peek_overflow = FALSE;
        return pmBufferOverflow;
    }
    if (queue->peek_flag) {
        memcpy(msg, queue->peek, (queue->msg_size - 1) * sizeof(int32_t));
        queue->peek_flag = FALSE;
        return pmGotData;
    }

    head = queue->head;
    /* if writer overflows, it writes queue->overflow = tail+1 so that
     * when the reader gets to that position in the buffer, it can 
     * return the overflow condition to the reader. The problem is that
     * at overflow, things have wrapped around, so tail == head, and the
     * reader will detect overflow immediately instead of waiting until
     * it reads everything in the buffer, wrapping around again to the
     * point where tail == head. So the condition also checks that
     * queue->buffer[head] is zero -- if so, then the buffer is now
     * empty, and we're at the point in the msg stream where overflow
     * occurred. It's time to signal overflow to the reader. If 
     * queue->buffer[head] is non-zero, there's a message there and we
     * should read all the way around the buffer before signalling overflow.
     * There is a write-order dependency here, but to fail, the overflow
     * field would have to be written while an entire buffer full of 
     * writes are still pending. I'm assuming out-of-order writes are
     * possible, but not that many.
     */
    if (queue->overflow == head + 1 && !queue->buffer[head]) {
        queue->overflow = 0; /* non-overflow condition */
        return pmBufferOverflow;
    }

    /* test to see if there is data in the queue -- test from back
     * to front so if writer is simultaneously writing, we don't
     * waste time discovering the write is not finished 
     */
    for (i = queue->msg_size - 1; i >= 0; i--) {
        if (!queue->buffer[head + i]) {
            return pmNoData;
        }
    }
    memcpy(msg, (char *) &queue->buffer[head + 1], 
           sizeof(int32_t) * (queue->msg_size - 1));
    /* fix up zeros */
    i = queue->buffer[head];
    while (i < queue->msg_size) {
        int32_t j;
        i--; /* msg does not have extra word so shift down */
        j = msg_as_int32[i];
        msg_as_int32[i] = 0;
        i = j;
    }
    /* signal that data has been removed by zeroing: */
    bzero((char *) &queue->buffer[head], sizeof(int32_t) * queue->msg_size);

    /* update head */
    head += queue->msg_size;
    if (head == queue->len) head = 0;
    queue->head = head;
    return pmGotData; /* success */
}